

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void RPCRunLater(string *name,function<void_()> func,int64_t nSeconds)

{
  bool bVar1;
  int iVar2;
  Logger *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UniValue *__return_storage_ptr__;
  int64_t in_RDX;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  pVar3;
  _Head_base<0UL,_RPCTimerBase_*,_false> local_58;
  int64_t nSeconds_local;
  UniqueLock<GlobalMutex> criticalblock17;
  undefined8 local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (timerInterface == (RPCTimerInterface *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    criticalblock17.super_unique_lock._M_device = (mutex_type *)&stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&criticalblock17,"No timer handler registered for RPC","");
    JSONRPCError(__return_storage_ptr__,-0x7f5b,(string *)&criticalblock17);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    criticalblock17.super_unique_lock._M_device = (mutex_type *)&g_deadline_timers_mutex;
    criticalblock17.super_unique_lock._M_owns = false;
    nSeconds_local = in_RDX;
    std::unique_lock<std::mutex>::lock(&criticalblock17.super_unique_lock);
    pVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
            ::equal_range(&deadlineTimers_abi_cxx11_._M_t,name);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
    ::_M_erase_aux(&deadlineTimers_abi_cxx11_._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    this = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this,RPC,Debug);
    if (bVar1) {
      iVar2 = (*timerInterface->_vptr_RPCTimerInterface[2])();
      local_58._M_head_impl = (RPCTimerBase *)CONCAT44(extraout_var,iVar2);
      logging_function._M_str = "RPCRunLater";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string,long,char_const*>
                (logging_function,source_file,0x23c,RPC,Debug,(ConstevalFormatString<3U>)0x81d12a,
                 name,&nSeconds_local,(char **)&local_58);
    }
    iVar2 = (*timerInterface->_vptr_RPCTimerInterface[3])
                      (timerInterface,nSeconds,nSeconds_local * 1000);
    local_58._M_head_impl = (RPCTimerBase *)CONCAT44(extraout_var_00,iVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
                *)&deadlineTimers_abi_cxx11_,name,
               (unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)&local_58);
    if (local_58._M_head_impl != (RPCTimerBase *)0x0) {
      (*(local_58._M_head_impl)->_vptr_RPCTimerBase[1])();
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock17.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void RPCRunLater(const std::string& name, std::function<void()> func, int64_t nSeconds)
{
    if (!timerInterface)
        throw JSONRPCError(RPC_INTERNAL_ERROR, "No timer handler registered for RPC");
    LOCK(g_deadline_timers_mutex);
    deadlineTimers.erase(name);
    LogDebug(BCLog::RPC, "queue run of timer %s in %i seconds (using %s)\n", name, nSeconds, timerInterface->Name());
    deadlineTimers.emplace(name, std::unique_ptr<RPCTimerBase>(timerInterface->NewTimer(func, nSeconds*1000)));
}